

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
DescriptorKeyInfo_Constructor_string_Test::TestBody(DescriptorKeyInfo_Constructor_string_Test *this)

{
  _Alloc_hider lhs;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  string extkey;
  string key_str;
  string path;
  AssertionResult gtest_ar;
  string parent_info;
  string local_1f0;
  string local_1d0;
  DescriptorKeyInfo key_info;
  
  std::__cxx11::string::string
            ((string *)&extkey,
             "tprv8fFXTTUs3e5Q1CGAPnabXXFUJor2q2jXo3VCceUggUNGMgCQ4FsLgPemcq2FPym15qZ2kjNx414T3Ypha1gAL3GHUH3uN3xDB3ymD434uWh"
             ,(allocator *)&key_info);
  std::__cxx11::string::string((string *)&parent_info,"[ef57314e/0\'/1]",(allocator *)&key_info);
  std::__cxx11::string::string((string *)&path,"0\'/1/*",(allocator *)&key_info);
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(&key_info);
  key_str._M_dataplus._M_p = (pointer)&key_str.field_2;
  key_str._M_string_length = 0;
  key_str.field_2._M_local_buf[0] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_1d0,"",(allocator *)&gtest_ar_);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
                ((DescriptorKeyInfo *)&gtest_ar,&extkey,&local_1d0);
      cfd::core::DescriptorKeyInfo::operator=(&key_info,(DescriptorKeyInfo *)&gtest_ar);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo((DescriptorKeyInfo *)&gtest_ar);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5c9,
               "Expected: key_info = DescriptorKeyInfo(extkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_((string *)&gtest_ar,&key_info);
      std::__cxx11::string::operator=((string *)&key_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5ca,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"key_str.c_str()","extkey.c_str()",key_str._M_dataplus._M_p,
             extkey._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5cb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_._0_4_ = cfd::core::DescriptorKeyInfo::GetKeyType(&key_info);
  gtest_ar_3.success_ = true;
  gtest_ar_3._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
            ((internal *)&gtest_ar,"key_info.GetKeyType()",
             "DescriptorKeyType::kDescriptorKeyBip32Priv",(DescriptorKeyType *)&gtest_ar_,
             (DescriptorKeyType *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5cc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gtest_ar_3,&extkey,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &gtest_ar_3,&path);
      std::__cxx11::string::string((string *)&local_1f0,(string *)&parent_info);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
                ((DescriptorKeyInfo *)&gtest_ar,(string *)&gtest_ar_,&local_1f0);
      cfd::core::DescriptorKeyInfo::operator=(&key_info,(DescriptorKeyInfo *)&gtest_ar);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo((DescriptorKeyInfo *)&gtest_ar);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&gtest_ar_3);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5ce,
               "Expected: key_info = DescriptorKeyInfo(extkey + \"/\" + path, parent_info) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_((string *)&gtest_ar,&key_info);
      std::__cxx11::string::operator=((string *)&key_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5cf,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  lhs._M_p = key_str._M_dataplus._M_p;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
                 &parent_info,&extkey);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
                 "/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                 &path);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"key_str.c_str()",
             "(parent_info + extkey + \"/\" + path).c_str()",lhs._M_p,
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5d0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  bVar1 = cfd::core::DescriptorKeyInfo::HasPrivkey(&key_info);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = !bVar1;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"key_info.HasPrivkey()"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5d1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::DescriptorKeyInfo::HasExtPubkey(&key_info);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"key_info.HasExtPubkey()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5d2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = cfd::core::DescriptorKeyInfo::HasExtPrivkey(&key_info);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"key_info.HasExtPrivkey()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5d3,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::DescriptorKeyInfo::GetExtPrivkey((ExtPrivkey *)&gtest_ar,&key_info);
  cfd::core::ExtPrivkey::ToString_abi_cxx11_((string *)&gtest_ar_,(ExtPrivkey *)&gtest_ar);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"key_info.GetExtPrivkey().ToString().c_str()","extkey.c_str()",
             (char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_),extkey._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5d4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::DescriptorKeyInfo::GetBip32Path_abi_cxx11_((string *)&gtest_ar,&key_info);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,"/"
                 ,&path);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"key_info.GetBip32Path().c_str()","(\"/\" + path).c_str()",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             (char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5d5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  std::__cxx11::string::~string((string *)&key_str);
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&key_info);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&parent_info);
  std::__cxx11::string::~string((string *)&extkey);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, Constructor_string) {
  std::string extkey = "tprv8fFXTTUs3e5Q1CGAPnabXXFUJor2q2jXo3VCceUggUNGMgCQ4FsLgPemcq2FPym15qZ2kjNx414T3Ypha1gAL3GHUH3uN3xDB3ymD434uWh";
  std::string parent_info = "[ef57314e/0'/1]";
  std::string path = "0'/1/*";
  DescriptorKeyInfo key_info;
  std::string key_str;

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(extkey));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), extkey.c_str());
  EXPECT_EQ(key_info.GetKeyType(),  DescriptorKeyType::kDescriptorKeyBip32Priv);

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(extkey + "/" + path, parent_info));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), (parent_info + extkey + "/" + path).c_str());
  EXPECT_FALSE(key_info.HasPrivkey());
  EXPECT_FALSE(key_info.HasExtPubkey());
  EXPECT_TRUE(key_info.HasExtPrivkey());
  EXPECT_STREQ(key_info.GetExtPrivkey().ToString().c_str(),  extkey.c_str());
  EXPECT_STREQ(key_info.GetBip32Path().c_str(),  ("/" + path).c_str());
}